

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O1

char * coda_type_get_special_type_name(coda_special_type special_type)

{
  if (special_type < 4) {
    return &DAT_00196e3c + *(int *)(&DAT_00196e3c + (ulong)special_type * 4);
  }
  return "unknown";
}

Assistant:

LIBCODA_API const char *coda_type_get_special_type_name(coda_special_type special_type)
{
    switch (special_type)
    {
        case coda_special_no_data:
            return "no_data";
        case coda_special_vsf_integer:
            return "vsf_integer";
        case coda_special_time:
            return "time";
        case coda_special_complex:
            return "complex";
    }

    return "unknown";
}